

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

char * l_str2dloc(char *s,lua_Number *result,int mode)

{
  byte *pbVar1;
  char *pcVar2;
  double dVar3;
  char *local_20;
  
  dVar3 = strtod(s,&local_20);
  *result = dVar3;
  if (local_20 == s) {
    pcVar2 = (char *)0x0;
  }
  else {
    local_20 = local_20 + -1;
    do {
      pbVar1 = (byte *)(local_20 + 1);
      local_20 = local_20 + 1;
    } while ((""[(ulong)*pbVar1 + 1] & 8) != 0);
    pcVar2 = (char *)0x0;
    if (*pbVar1 == 0) {
      pcVar2 = local_20;
    }
  }
  return pcVar2;
}

Assistant:

static const char *l_str2dloc (const char *s, lua_Number *result, int mode) {
  char *endptr;
  *result = (mode == 'x') ? lua_strx2number(s, &endptr)  /* try to convert */
                          : lua_str2number(s, &endptr);
  if (endptr == s) return NULL;  /* nothing recognized? */
  while (lisspace(cast_uchar(*endptr))) endptr++;  /* skip trailing spaces */
  return (*endptr == '\0') ? endptr : NULL;  /* OK iff no trailing chars */
}